

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  char *pcVar5;
  PrimRefMB *pPVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  size_t itime;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  size_t sVar24;
  int iVar25;
  undefined4 uVar26;
  BufferView<embree::Vec3fa> *pBVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  unsigned_long uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  uint uVar62;
  float fVar63;
  uint uVar73;
  uint uVar74;
  Vec3fa n0;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  uint uVar75;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar76;
  uint uVar84;
  float fVar85;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [12];
  float fVar100;
  vfloat4 a0;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar99;
  float fVar105;
  float fVar106;
  undefined1 auVar107 [12];
  float fVar113;
  Vec3ff v3;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar112;
  float fVar118;
  undefined1 auVar119 [12];
  float fVar127;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar128;
  float fVar129;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar126;
  float fVar130;
  undefined1 auVar133 [12];
  float fVar138;
  Vec3fa n1;
  float fVar131;
  float fVar132;
  float fVar139;
  float fVar140;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar137;
  float fVar144;
  float fVar145;
  vfloat4 a_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  float fVar155;
  float fVar157;
  undefined1 auVar149 [16];
  float fVar147;
  uint uVar148;
  uint uVar156;
  uint uVar158;
  uint uVar159;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar160;
  float fVar161;
  uint uVar162;
  float fVar165;
  float fVar166;
  float fVar168;
  float fVar169;
  undefined1 auVar163 [16];
  uint uVar167;
  uint uVar170;
  undefined1 auVar164 [16];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  uint uVar178;
  uint uVar179;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  uint uVar186;
  float fVar189;
  uint uVar190;
  float fVar191;
  uint uVar192;
  uint uVar193;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 local_3b8 [16];
  undefined1 local_398 [16];
  float local_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  uint local_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint local_348;
  uint uStack_344;
  uint uStack_340;
  uint uStack_33c;
  ulong local_338;
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint local_308;
  uint uStack_304;
  uint uStack_300;
  uint uStack_2fc;
  size_t local_2d0;
  unsigned_long local_2c8;
  size_t local_2c0;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  BBox1f local_218;
  undefined1 local_138 [8];
  float fStack_130;
  float fStack_12c;
  anon_class_16_2_07cfa4d6 local_f0;
  ulong local_e0;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar32 = r->_begin;
  local_218.lower = 0.0;
  local_218.upper = 1.0;
  local_2c8 = 0;
  local_338 = 0;
  local_2d0 = 0;
  fVar20 = 0.0;
  local_37c = 1.0;
  local_228._8_8_ = 0xff800000ff800000;
  local_228._0_8_ = 0xff800000ff800000;
  local_238._8_8_ = 0x7f8000007f800000;
  local_238._0_8_ = 0x7f8000007f800000;
  local_248._8_8_ = 0xff800000ff800000;
  local_248._0_8_ = 0xff800000ff800000;
  local_258._8_8_ = 0x7f8000007f800000;
  local_258._0_8_ = 0x7f8000007f800000;
  local_278._8_8_ = 0xff800000ff800000;
  local_278._0_8_ = 0xff800000ff800000;
  local_288._8_8_ = 0x7f8000007f800000;
  local_288._0_8_ = 0x7f8000007f800000;
  local_2c0 = k;
  while( true ) {
    if (r->_end <= uVar32) {
      (__return_storage_ptr__->object_range)._end = local_2c8;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_288._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_288._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_278._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_278._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        lower.field_0 = local_258._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.lower.field_0 + 8) = local_258._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
        upper.field_0 = local_248._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds1.upper.field_0 + 8) = local_248._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
        field_0 = local_238._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               lower.field_0 + 8) = local_238._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
        field_0 = local_228._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.
               upper.field_0 + 8) = local_228._8_8_;
      (__return_storage_ptr__->time_range).lower = local_37c;
      (__return_storage_ptr__->time_range).upper = fVar20;
      __return_storage_ptr__->num_time_segments = local_2d0;
      __return_storage_ptr__->max_num_time_segments = local_338;
      __return_storage_ptr__->max_time_range = local_218;
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    fVar106 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.fnumTimeSegments;
    fVar40 = t0t1->lower;
    fVar41 = t0t1->upper;
    fVar63 = BVar2.lower;
    fVar86 = BVar2.upper - fVar63;
    fVar34 = ceilf(((fVar41 - fVar63) / fVar86) * 0.99999976 * fVar106);
    uVar76 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                super_CurveGeometry.field_0x68 * uVar32);
    uVar22 = (ulong)(uVar76 + 3);
    pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             vertices.items;
    if (uVar22 < (pBVar3->super_RawBufferView).num) break;
LAB_0024844d:
    uVar32 = uVar32 + 1;
  }
  if (fVar106 <= fVar34) {
    fVar34 = fVar106;
  }
  fVar86 = floorf(((fVar40 - fVar63) / fVar86) * 1.0000002 * fVar106);
  fVar63 = 0.0;
  if (0.0 <= fVar86) {
    fVar63 = fVar86;
  }
  uVar21 = (ulong)(int)fVar63;
  pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  fVar63 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar27 = pBVar4;
LAB_00247378:
  if ((ulong)(long)(int)fVar34 < uVar21) {
    local_f0.primID = &local_e0;
    fVar34 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.time_range.lower;
    fVar63 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
             super_Geometry.time_range.upper - fVar34;
    fVar86 = (fVar40 - fVar34) / fVar63;
    fVar63 = (fVar41 - fVar34) / fVar63;
    fVar34 = fVar106 * fVar63;
    local_f0.this = this;
    local_e0 = uVar32;
    fVar40 = floorf(fVar106 * fVar86);
    fVar41 = ceilf(fVar34);
    iVar25 = (int)fVar40;
    if (fVar40 <= 0.0) {
      fVar40 = 0.0;
    }
    fVar101 = fVar41;
    if (fVar106 <= fVar41) {
      fVar101 = fVar106;
    }
    iVar23 = -1;
    if (-1 < iVar25) {
      iVar23 = iVar25;
    }
    iVar7 = (int)fVar106 + 1;
    if ((int)fVar41 < (int)fVar106 + 1) {
      iVar7 = (int)fVar41;
    }
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_f0,(long)(int)fVar40);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_f0,(long)(int)fVar101);
    fVar41 = fVar106 * fVar86 - fVar40;
    if (iVar7 - iVar23 == 1) {
      if (fVar41 <= 0.0) {
        fVar41 = 0.0;
      }
      fVar106 = 1.0 - fVar41;
      auVar119._0_4_ =
           fVar106 * blower0.lower.field_0.m128[0] + fVar41 * bupper1.lower.field_0.m128[0];
      auVar119._4_4_ =
           fVar106 * blower0.lower.field_0.m128[1] + fVar41 * bupper1.lower.field_0.m128[1];
      auVar119._8_4_ =
           fVar106 * blower0.lower.field_0.m128[2] + fVar41 * bupper1.lower.field_0.m128[2];
      auVar107._0_4_ =
           fVar106 * blower0.upper.field_0.m128[0] + fVar41 * bupper1.upper.field_0.m128[0];
      auVar107._4_4_ =
           fVar106 * blower0.upper.field_0.m128[1] + fVar41 * bupper1.upper.field_0.m128[1];
      auVar107._8_4_ =
           fVar106 * blower0.upper.field_0.m128[2] + fVar41 * bupper1.upper.field_0.m128[2];
      fVar106 = fVar101 - fVar34;
      if (fVar101 - fVar34 <= 0.0) {
        fVar106 = 0.0;
      }
      fVar40 = 1.0 - fVar106;
      auVar133._0_4_ =
           bupper1.lower.field_0.m128[0] * fVar40 + blower0.lower.field_0.m128[0] * fVar106;
      auVar133._4_4_ =
           bupper1.lower.field_0.m128[1] * fVar40 + blower0.lower.field_0.m128[1] * fVar106;
      auVar133._8_4_ =
           bupper1.lower.field_0.m128[2] * fVar40 + blower0.lower.field_0.m128[2] * fVar106;
      auVar92._0_4_ =
           fVar40 * bupper1.upper.field_0.m128[0] + fVar106 * blower0.upper.field_0.m128[0];
      auVar92._4_4_ =
           fVar40 * bupper1.upper.field_0.m128[1] + fVar106 * blower0.upper.field_0.m128[1];
      auVar92._8_4_ =
           fVar40 * bupper1.upper.field_0.m128[2] + fVar106 * blower0.upper.field_0.m128[2];
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_f0,(long)((int)fVar40 + 1))
      ;
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_f0,(long)((int)fVar101 + -1));
      if (fVar41 <= 0.0) {
        fVar41 = 0.0;
      }
      fVar40 = 1.0 - fVar41;
      auVar149._0_4_ =
           blower0.lower.field_0.m128[0] * fVar40 + blower1.lower.field_0.m128[0] * fVar41;
      auVar149._4_4_ =
           blower0.lower.field_0.m128[1] * fVar40 + blower1.lower.field_0.m128[1] * fVar41;
      auVar149._8_4_ =
           blower0.lower.field_0.m128[2] * fVar40 + blower1.lower.field_0.m128[2] * fVar41;
      auVar149._12_4_ =
           blower0.lower.field_0.m128[3] * fVar40 + blower1.lower.field_0.m128[3] * fVar41;
      auVar66._0_4_ =
           fVar40 * blower0.upper.field_0.m128[0] + fVar41 * blower1.upper.field_0.m128[0];
      auVar66._4_4_ =
           fVar40 * blower0.upper.field_0.m128[1] + fVar41 * blower1.upper.field_0.m128[1];
      auVar66._8_4_ =
           fVar40 * blower0.upper.field_0.m128[2] + fVar41 * blower1.upper.field_0.m128[2];
      auVar66._12_4_ =
           fVar40 * blower0.upper.field_0.m128[3] + fVar41 * blower1.upper.field_0.m128[3];
      fVar40 = fVar101 - fVar34;
      if (fVar101 - fVar34 <= 0.0) {
        fVar40 = 0.0;
      }
      fVar41 = 1.0 - fVar40;
      auVar94._0_4_ =
           bupper1.lower.field_0.m128[0] * fVar41 + bupper0.lower.field_0.m128[0] * fVar40;
      auVar94._4_4_ =
           bupper1.lower.field_0.m128[1] * fVar41 + bupper0.lower.field_0.m128[1] * fVar40;
      auVar94._8_4_ =
           bupper1.lower.field_0.m128[2] * fVar41 + bupper0.lower.field_0.m128[2] * fVar40;
      auVar94._12_4_ =
           bupper1.lower.field_0.m128[3] * fVar41 + bupper0.lower.field_0.m128[3] * fVar40;
      auVar93._0_4_ =
           fVar41 * bupper1.upper.field_0.m128[0] + fVar40 * bupper0.upper.field_0.m128[0];
      auVar93._4_4_ =
           fVar41 * bupper1.upper.field_0.m128[1] + fVar40 * bupper0.upper.field_0.m128[1];
      auVar93._8_4_ =
           fVar41 * bupper1.upper.field_0.m128[2] + fVar40 * bupper0.upper.field_0.m128[2];
      auVar93._12_4_ =
           fVar41 * bupper1.upper.field_0.m128[3] + fVar40 * bupper0.upper.field_0.m128[3];
      if (iVar25 < 0) {
        iVar25 = -1;
      }
      sVar24 = (size_t)iVar25;
      while( true ) {
        auVar92 = auVar93._0_12_;
        auVar133 = auVar94._0_12_;
        auVar107 = auVar66._0_12_;
        auVar119 = auVar149._0_12_;
        sVar24 = sVar24 + 1;
        if ((long)iVar7 <= (long)sVar24) break;
        fVar40 = ((float)(int)sVar24 / fVar106 - fVar86) / (fVar63 - fVar86);
        fVar103 = 1.0 - fVar40;
        fVar41 = auVar94._4_4_;
        fVar34 = auVar94._8_4_;
        fVar101 = auVar94._12_4_;
        fVar35 = auVar149._4_4_;
        fVar127 = auVar149._8_4_;
        fVar128 = auVar149._12_4_;
        fVar85 = auVar93._4_4_;
        fVar36 = auVar93._8_4_;
        fVar114 = auVar93._12_4_;
        fVar116 = auVar66._4_4_;
        fVar118 = auVar66._8_4_;
        fVar37 = auVar66._12_4_;
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_f0,sVar24);
        auVar151._0_4_ =
             bi.lower.field_0.m128[0] - (auVar149._0_4_ * fVar103 + auVar94._0_4_ * fVar40);
        auVar151._4_4_ = bi.lower.field_0.m128[1] - (fVar35 * fVar103 + fVar41 * fVar40);
        auVar151._8_4_ = bi.lower.field_0.m128[2] - (fVar127 * fVar103 + fVar34 * fVar40);
        auVar151._12_4_ = bi.lower.field_0.m128[3] - (fVar128 * fVar103 + fVar101 * fVar40);
        auVar184._0_4_ =
             bi.upper.field_0.m128[0] - (fVar103 * auVar66._0_4_ + fVar40 * auVar93._0_4_);
        auVar184._4_4_ = bi.upper.field_0.m128[1] - (fVar103 * fVar116 + fVar40 * fVar85);
        auVar184._8_4_ = bi.upper.field_0.m128[2] - (fVar103 * fVar118 + fVar40 * fVar36);
        auVar184._12_4_ = bi.upper.field_0.m128[3] - (fVar103 * fVar37 + fVar40 * fVar114);
        auVar151 = minps(auVar151,ZEXT816(0));
        auVar184 = maxps(auVar184,ZEXT816(0));
        auVar149._0_4_ = auVar149._0_4_ + auVar151._0_4_;
        auVar149._4_4_ = fVar35 + auVar151._4_4_;
        auVar149._8_4_ = fVar127 + auVar151._8_4_;
        auVar149._12_4_ = fVar128 + auVar151._12_4_;
        auVar94._0_4_ = auVar94._0_4_ + auVar151._0_4_;
        auVar94._4_4_ = fVar41 + auVar151._4_4_;
        auVar94._8_4_ = fVar34 + auVar151._8_4_;
        auVar94._12_4_ = fVar101 + auVar151._12_4_;
        auVar66._0_4_ = auVar66._0_4_ + auVar184._0_4_;
        auVar66._4_4_ = fVar116 + auVar184._4_4_;
        auVar66._8_4_ = fVar118 + auVar184._8_4_;
        auVar66._12_4_ = fVar37 + auVar184._12_4_;
        auVar93._0_4_ = auVar93._0_4_ + auVar184._0_4_;
        auVar93._4_4_ = fVar85 + auVar184._4_4_;
        auVar93._8_4_ = fVar36 + auVar184._8_4_;
        auVar93._12_4_ = fVar114 + auVar184._12_4_;
      }
    }
    fVar106 = (float)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                      super_CurveGeometry.super_Geometry.numTimeSteps - 1);
    uVar22 = (ulong)(uint)fVar106;
    aVar126.m128[3] = (float)geomID;
    aVar126._0_12_ = auVar119;
    aVar112.m128[3] = (float)uVar32;
    aVar112._0_12_ = auVar107;
    aVar137.m128[3] = fVar106;
    aVar137._0_12_ = auVar133;
    aVar99.m128[3] = fVar106;
    aVar99._0_12_ = auVar92;
    auVar187._0_4_ =
         auVar107._0_4_ * 0.5 + auVar92._0_4_ * 0.5 + auVar119._0_4_ * 0.5 + auVar133._0_4_ * 0.5;
    auVar187._4_4_ =
         auVar107._4_4_ * 0.5 + auVar92._4_4_ * 0.5 + auVar119._4_4_ * 0.5 + auVar133._4_4_ * 0.5;
    auVar187._8_4_ =
         auVar107._8_4_ * 0.5 + auVar92._8_4_ * 0.5 + auVar119._8_4_ * 0.5 + auVar133._8_4_ * 0.5;
    auVar187._12_4_ = (float)uVar32 * 0.5 + fVar106 * 0.5 + (float)geomID * 0.5 + fVar106 * 0.5;
    BVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    local_288 = minps(local_288,(undefined1  [16])aVar126);
    local_2c8 = local_2c8 + 1;
    local_2d0 = local_2d0 + uVar22;
    bVar33 = local_338 < uVar22;
    if (local_338 <= uVar22) {
      local_338 = uVar22;
    }
    pPVar6 = prims->items;
    pPVar6[local_2c0].lbounds.bounds0.lower.field_0 = aVar126;
    local_278 = maxps(local_278,(undefined1  [16])aVar112);
    pPVar6[local_2c0].lbounds.bounds0.upper.field_0 = aVar112;
    local_258 = minps(local_258,(undefined1  [16])aVar137);
    pPVar6[local_2c0].lbounds.bounds1.lower.field_0 = aVar137;
    local_248 = maxps(local_248,(undefined1  [16])aVar99);
    pPVar6[local_2c0].lbounds.bounds1.upper.field_0 = aVar99;
    pPVar6[local_2c0].time_range = BVar2;
    local_238 = minps(local_238,auVar187);
    local_228 = maxps(local_228,auVar187);
    fVar106 = BVar2.lower;
    if (fVar106 <= local_37c) {
      local_37c = fVar106;
    }
    fVar41 = BVar2.upper;
    fVar40 = fVar41;
    if (fVar41 <= fVar20) {
      fVar40 = fVar20;
    }
    uVar76 = (int)((uint)bVar33 << 0x1f) >> 0x1f;
    uVar84 = (int)((uint)bVar33 << 0x1f) >> 0x1f;
    local_2c0 = local_2c0 + 1;
    local_218.upper = (float)(~uVar84 & (uint)local_218.upper | (uint)fVar41 & uVar84);
    local_218.lower = (float)(~uVar76 & (uint)local_218.lower | (uint)fVar106 & uVar76);
    fVar20 = fVar40;
  }
  else {
    pcVar5 = pBVar3[uVar21].super_RawBufferView.ptr_ofs;
    sVar24 = pBVar3[uVar21].super_RawBufferView.stride;
    lVar31 = sVar24 * uVar76;
    lVar30 = sVar24 * (uVar76 + 1);
    lVar29 = sVar24 * (uVar76 + 2);
    auVar136._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar30 + 0xc)));
    auVar136._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar31 + 0xc)));
    auVar136._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar29 + 0xc)));
    auVar136._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + sVar24 * uVar22 + 0xc)));
    iVar25 = movmskps((int)pBVar27,auVar136);
    if (iVar25 == 0) {
      pfVar1 = (float *)(pcVar5 + lVar31);
      fVar86 = *pfVar1;
      fVar101 = pfVar1[1];
      fVar103 = pfVar1[2];
      fVar35 = pfVar1[3];
      auVar143._0_4_ = -(uint)(fVar86 < 1.844e+18 && -1.844e+18 < fVar86);
      auVar143._4_4_ = -(uint)(fVar101 < 1.844e+18 && -1.844e+18 < fVar101);
      auVar143._8_4_ = -(uint)(fVar103 < 1.844e+18 && -1.844e+18 < fVar103);
      auVar143._12_4_ = -(uint)(fVar35 < 1.844e+18 && -1.844e+18 < fVar35);
      uVar26 = movmskps(0,auVar143);
      if ((~(byte)uVar26 & 7) == 0) {
        pfVar1 = (float *)(pcVar5 + lVar30);
        fVar127 = *pfVar1;
        fVar128 = pfVar1[1];
        fVar85 = pfVar1[2];
        fVar36 = pfVar1[3];
        auVar177._0_4_ = -(uint)(fVar127 < 1.844e+18 && -1.844e+18 < fVar127);
        auVar177._4_4_ = -(uint)(fVar128 < 1.844e+18 && -1.844e+18 < fVar128);
        auVar177._8_4_ = -(uint)(fVar85 < 1.844e+18 && -1.844e+18 < fVar85);
        auVar177._12_4_ = -(uint)(fVar36 < 1.844e+18 && -1.844e+18 < fVar36);
        uVar26 = movmskps(CONCAT31((int3)((uint)uVar26 >> 8),~(byte)uVar26),auVar177);
        if ((~(byte)uVar26 & 7) == 0) {
          pfVar1 = (float *)(pcVar5 + lVar29);
          fVar114 = *pfVar1;
          fVar116 = pfVar1[1];
          fVar118 = pfVar1[2];
          fVar37 = pfVar1[3];
          auVar64._0_4_ = -(uint)(fVar114 < 1.844e+18 && -1.844e+18 < fVar114);
          auVar64._4_4_ = -(uint)(fVar116 < 1.844e+18 && -1.844e+18 < fVar116);
          auVar64._8_4_ = -(uint)(fVar118 < 1.844e+18 && -1.844e+18 < fVar118);
          auVar64._12_4_ = -(uint)(fVar37 < 1.844e+18 && -1.844e+18 < fVar37);
          uVar26 = movmskps(CONCAT31((int3)((uint)uVar26 >> 8),~(byte)uVar26),auVar64);
          if ((~(byte)uVar26 & 7) == 0) {
            auVar66 = *(undefined1 (*) [16])(pcVar5 + sVar24 * uVar22);
            fVar105 = auVar66._0_4_;
            fVar113 = auVar66._4_4_;
            fVar115 = auVar66._8_4_;
            fVar117 = auVar66._12_4_;
            auVar65._0_4_ = -(uint)(fVar105 < 1.844e+18 && -1.844e+18 < fVar105);
            auVar65._4_4_ = -(uint)(fVar113 < 1.844e+18 && -1.844e+18 < fVar113);
            auVar65._8_4_ = -(uint)(fVar115 < 1.844e+18 && -1.844e+18 < fVar115);
            auVar65._12_4_ = -(uint)(fVar117 < 1.844e+18 && -1.844e+18 < fVar117);
            uVar26 = movmskps(CONCAT31((int3)((uint)uVar26 >> 8),~(byte)uVar26),auVar65);
            if ((~(byte)uVar26 & 7) == 0) {
              pcVar5 = pBVar4[uVar21].super_RawBufferView.ptr_ofs;
              sVar24 = pBVar4[uVar21].super_RawBufferView.stride;
              lVar29 = sVar24 * uVar76;
              pfVar1 = (float *)(pcVar5 + lVar29);
              fVar129 = *pfVar1;
              fVar132 = pfVar1[1];
              fVar166 = pfVar1[2];
              auVar120._0_4_ = -(uint)(fVar129 < 1.844e+18 && -1.844e+18 < fVar129);
              auVar120._4_4_ = -(uint)(fVar132 < 1.844e+18 && -1.844e+18 < fVar132);
              auVar120._8_4_ = -(uint)(fVar166 < 1.844e+18 && -1.844e+18 < fVar166);
              auVar120._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
              uVar26 = movmskps((int)lVar29,auVar120);
              if ((~(byte)uVar26 & 7) == 0) {
                lVar29 = sVar24 * (uVar76 + 1);
                auVar66 = *(undefined1 (*) [16])(pcVar5 + lVar29);
                fVar130 = auVar66._0_4_;
                fVar169 = auVar66._4_4_;
                fVar161 = auVar66._8_4_;
                auVar121._0_4_ = -(uint)(fVar130 < 1.844e+18 && -1.844e+18 < fVar130);
                auVar121._4_4_ = -(uint)(fVar169 < 1.844e+18 && -1.844e+18 < fVar169);
                auVar121._8_4_ = -(uint)(fVar161 < 1.844e+18 && -1.844e+18 < fVar161);
                auVar121._12_4_ = -(uint)(auVar66._12_4_ < 1.844e+18 && -1.844e+18 < auVar66._12_4_)
                ;
                uVar26 = movmskps((int)lVar29,auVar121);
                if ((~(byte)uVar26 & 7) == 0) goto code_r0x002474f9;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0024844d;
code_r0x002474f9:
  fVar35 = fVar35 * fVar63;
  fVar36 = fVar36 * fVar63;
  fVar37 = fVar37 * fVar63;
  fVar117 = fVar117 * fVar63;
  lVar29 = sVar24 * (uVar76 + 2);
  pfVar1 = (float *)(pcVar5 + lVar29);
  fVar144 = *pfVar1;
  fVar145 = pfVar1[1];
  fVar147 = pfVar1[2];
  pfVar1 = (float *)(pcVar5 + sVar24 * uVar22);
  fVar171 = *pfVar1;
  fVar189 = pfVar1[1];
  fVar191 = pfVar1[2];
  fVar91 = (fVar114 * 0.5 + fVar105 * 0.0 + fVar127 * 0.0) - fVar86 * 0.5;
  fVar100 = (fVar116 * 0.5 + fVar113 * 0.0 + fVar128 * 0.0) - fVar101 * 0.5;
  fVar102 = (fVar118 * 0.5 + fVar115 * 0.0 + fVar85 * 0.0) - fVar103 * 0.5;
  fVar104 = (fVar37 * 0.5 + fVar117 * 0.0 + fVar36 * 0.0) - fVar35 * 0.5;
  fVar146 = (fVar144 * 0.5 + fVar171 * 0.0 + fVar130 * 0.0) - fVar129 * 0.5;
  fVar155 = (fVar145 * 0.5 + fVar189 * 0.0 + fVar169 * 0.0) - fVar132 * 0.5;
  fVar157 = (fVar147 * 0.5 + fVar191 * 0.0 + fVar161 * 0.0) - fVar166 * 0.5;
  fVar38 = fVar114 * 0.0 + fVar105 * -0.0 + fVar127 + fVar86 * -0.0;
  fVar56 = fVar116 * 0.0 + fVar113 * -0.0 + fVar128 + fVar101 * -0.0;
  fVar58 = fVar118 * 0.0 + fVar115 * -0.0 + fVar85 + fVar103 * -0.0;
  fVar60 = fVar37 * 0.0 + fVar117 * -0.0 + fVar36 + fVar35 * -0.0;
  fVar160 = fVar144 * 0.0 + fVar171 * -0.0 + fVar130 + fVar129 * -0.0;
  fVar165 = fVar145 * 0.0 + fVar189 * -0.0 + fVar169 + fVar132 * -0.0;
  fVar168 = fVar147 * 0.0 + fVar191 * -0.0 + fVar161 + fVar166 * -0.0;
  fVar39 = fVar105 * -0.0 + fVar114 + fVar127 * 0.0 + fVar86 * -0.0;
  fVar57 = fVar113 * -0.0 + fVar116 + fVar128 * 0.0 + fVar101 * -0.0;
  fVar59 = fVar115 * -0.0 + fVar118 + fVar85 * 0.0 + fVar103 * -0.0;
  fVar61 = fVar117 * -0.0 + fVar37 + fVar36 * 0.0 + fVar35 * -0.0;
  fVar131 = fVar86 * 0.0 + ((fVar105 * 0.5 + fVar114 * 0.0) - fVar127 * 0.5);
  fVar138 = fVar101 * 0.0 + ((fVar113 * 0.5 + fVar116 * 0.0) - fVar128 * 0.5);
  fVar139 = fVar103 * 0.0 + ((fVar115 * 0.5 + fVar118 * 0.0) - fVar85 * 0.5);
  fVar140 = fVar35 * 0.0 + ((fVar117 * 0.5 + fVar37 * 0.0) - fVar36 * 0.5);
  fVar35 = fVar171 * -0.0 + fVar144 + fVar130 * 0.0 + fVar129 * -0.0;
  fVar127 = fVar189 * -0.0 + fVar145 + fVar169 * 0.0 + fVar132 * -0.0;
  fVar128 = fVar191 * -0.0 + fVar147 + fVar161 * 0.0 + fVar166 * -0.0;
  fVar86 = fVar129 * 0.0 + ((fVar171 * 0.5 + fVar144 * 0.0) - fVar130 * 0.5);
  fVar101 = fVar132 * 0.0 + ((fVar189 * 0.5 + fVar145 * 0.0) - fVar169 * 0.5);
  fVar103 = fVar166 * 0.0 + ((fVar191 * 0.5 + fVar147 * 0.0) - fVar161 * 0.5);
  fVar161 = fVar160 * fVar100 - fVar165 * fVar91;
  fVar166 = fVar165 * fVar102 - fVar168 * fVar100;
  fVar169 = fVar168 * fVar91 - fVar160 * fVar102;
  fVar36 = fVar100 * fVar146 - fVar155 * fVar91;
  fVar114 = fVar102 * fVar155 - fVar157 * fVar100;
  fVar116 = fVar91 * fVar157 - fVar146 * fVar102;
  fVar118 = fVar35 * fVar138 - fVar127 * fVar131;
  fVar105 = fVar127 * fVar139 - fVar128 * fVar138;
  fVar115 = fVar128 * fVar131 - fVar35 * fVar139;
  fVar35 = fVar138 * fVar86 - fVar101 * fVar131;
  fVar128 = fVar139 * fVar101 - fVar103 * fVar138;
  fVar85 = fVar131 * fVar103 - fVar86 * fVar139;
  fVar101 = fVar169 * fVar169 + fVar166 * fVar166 + fVar161 * fVar161;
  auVar149 = ZEXT416((uint)fVar101);
  auVar66 = rsqrtss(ZEXT416((uint)fVar101),auVar149);
  fVar86 = auVar66._0_4_;
  fVar103 = fVar86 * 1.5 - fVar86 * fVar86 * fVar101 * 0.5 * fVar86;
  fVar171 = fVar161 * fVar36 + fVar169 * fVar116 + fVar166 * fVar114;
  auVar66 = rcpss(auVar149,auVar149);
  fVar86 = (2.0 - fVar101 * auVar66._0_4_) * auVar66._0_4_;
  fVar132 = fVar115 * fVar115 + fVar105 * fVar105 + fVar118 * fVar118;
  auVar66 = ZEXT416((uint)fVar132);
  auVar149 = rsqrtss(ZEXT416((uint)fVar132),auVar66);
  fVar127 = auVar149._0_4_;
  fVar37 = fVar127 * 1.5 - fVar127 * fVar127 * fVar132 * 0.5 * fVar127;
  fVar147 = fVar118 * fVar35 + fVar115 * fVar85 + fVar105 * fVar128;
  auVar66 = rcpss(auVar66,auVar66);
  fVar127 = (2.0 - fVar132 * auVar66._0_4_) * auVar66._0_4_;
  fVar117 = fVar60 * fVar166 * fVar103;
  fVar113 = fVar60 * fVar169 * fVar103;
  fVar129 = fVar60 * fVar161 * fVar103;
  fVar130 = fVar38 - fVar117;
  fVar144 = fVar56 - fVar113;
  fVar145 = fVar58 - fVar129;
  fVar166 = fVar60 * fVar86 * (fVar101 * fVar114 - fVar171 * fVar166) * fVar103 +
            fVar104 * fVar166 * fVar103;
  fVar169 = fVar60 * fVar86 * (fVar101 * fVar116 - fVar171 * fVar169) * fVar103 +
            fVar104 * fVar169 * fVar103;
  fVar161 = fVar60 * fVar86 * (fVar101 * fVar36 - fVar171 * fVar161) * fVar103 +
            fVar104 * fVar161 * fVar103;
  fVar86 = fVar61 * fVar105 * fVar37;
  fVar101 = fVar61 * fVar115 * fVar37;
  fVar103 = fVar61 * fVar118 * fVar37;
  fVar171 = fVar39 - fVar86;
  fVar189 = fVar57 - fVar101;
  fVar191 = fVar59 - fVar103;
  fVar36 = fVar61 * fVar127 * (fVar132 * fVar128 - fVar147 * fVar105) * fVar37 +
           fVar140 * fVar105 * fVar37;
  fVar85 = fVar61 * fVar127 * (fVar132 * fVar85 - fVar147 * fVar115) * fVar37 +
           fVar140 * fVar115 * fVar37;
  fVar114 = fVar61 * fVar127 * (fVar132 * fVar35 - fVar147 * fVar118) * fVar37 +
            fVar140 * fVar118 * fVar37;
  fVar116 = (fVar91 - fVar166) * 0.33333334 + fVar130;
  fVar118 = (fVar100 - fVar169) * 0.33333334 + fVar144;
  fVar37 = (fVar102 - fVar161) * 0.33333334 + fVar145;
  fVar35 = fVar171 - (fVar131 - fVar36) * 0.33333334;
  fVar127 = fVar189 - (fVar138 - fVar85) * 0.33333334;
  fVar128 = fVar191 - (fVar139 - fVar114) * 0.33333334;
  uVar28 = 0;
  local_348 = 0xff800000;
  uStack_344 = 0xff800000;
  uStack_340 = 0xff800000;
  uStack_33c = 0xff800000;
  local_358 = 0xff800000;
  uStack_354 = 0xff800000;
  uStack_350 = 0xff800000;
  uStack_34c = 0xff800000;
  local_378._8_8_ = 0xff800000ff800000;
  local_378._0_8_ = 0xff800000ff800000;
  local_398._8_8_ = 0x7f8000007f800000;
  local_398._0_8_ = 0x7f8000007f800000;
  local_318 = 0x7f800000;
  uStack_314 = 0x7f800000;
  uStack_310 = 0x7f800000;
  uStack_30c = 0x7f800000;
  local_308 = 0x7f800000;
  uStack_304 = 0x7f800000;
  uStack_300 = 0x7f800000;
  uStack_2fc = 0x7f800000;
  while( true ) {
    uVar84 = local_378._0_4_;
    uVar178 = local_378._8_4_;
    uVar179 = local_378._12_4_;
    if (7 < uVar28) break;
    uVar193 = (uint)uVar28;
    uVar62 = -(uint)(-0x7ffffff9 < (int)(uVar193 ^ 0x80000000));
    uVar73 = -(uint)(-0x7ffffff9 < (int)(uVar193 ^ 0x80000000));
    uVar74 = -(uint)(-0x7ffffff9 < (int)(uVar193 ^ 0x80000000));
    uVar75 = -(uint)(-0x7ffffff9 < (int)(uVar193 ^ 0x80000000));
    lVar30 = uVar28 * 4;
    fVar105 = *(float *)(bezier_basis0 + lVar30 + 0x1dc);
    fVar115 = *(float *)(bezier_basis0 + lVar30 + 0x1e0);
    fVar132 = *(float *)(bezier_basis0 + lVar30 + 0x1e4);
    fVar147 = *(float *)(bezier_basis0 + lVar30 + 0x1e8);
    lVar30 = uVar28 * 4;
    fVar60 = *(float *)(bezier_basis0 + lVar30 + 0x660);
    fVar61 = *(float *)(bezier_basis0 + lVar30 + 0x664);
    fVar104 = *(float *)(bezier_basis0 + lVar30 + 0x668);
    fVar140 = *(float *)(bezier_basis0 + lVar30 + 0x66c);
    lVar30 = uVar28 * 4;
    fVar146 = *(float *)(bezier_basis0 + lVar30 + 0xae4);
    fVar155 = *(float *)(bezier_basis0 + lVar30 + 0xae8);
    fVar157 = *(float *)(bezier_basis0 + lVar30 + 0xaec);
    fVar160 = *(float *)(bezier_basis0 + lVar30 + 0xaf0);
    lVar30 = uVar28 * 4;
    fVar165 = *(float *)(bezier_basis0 + lVar30 + 0xf68);
    fVar168 = *(float *)(bezier_basis0 + lVar30 + 0xf6c);
    fVar8 = *(float *)(bezier_basis0 + lVar30 + 0xf70);
    fVar9 = *(float *)(bezier_basis0 + lVar30 + 0xf74);
    auVar87._0_4_ = fVar130 * fVar105 + fVar116 * fVar60 + fVar35 * fVar146 + fVar171 * fVar165;
    auVar87._4_4_ = fVar130 * fVar115 + fVar116 * fVar61 + fVar35 * fVar155 + fVar171 * fVar168;
    auVar87._8_4_ = fVar130 * fVar132 + fVar116 * fVar104 + fVar35 * fVar157 + fVar171 * fVar8;
    auVar87._12_4_ = fVar130 * fVar147 + fVar116 * fVar140 + fVar35 * fVar160 + fVar171 * fVar9;
    auVar141._0_4_ = fVar144 * fVar105 + fVar118 * fVar60 + fVar127 * fVar146 + fVar189 * fVar165;
    auVar141._4_4_ = fVar144 * fVar115 + fVar118 * fVar61 + fVar127 * fVar155 + fVar189 * fVar168;
    auVar141._8_4_ = fVar144 * fVar132 + fVar118 * fVar104 + fVar127 * fVar157 + fVar189 * fVar8;
    auVar141._12_4_ = fVar144 * fVar147 + fVar118 * fVar140 + fVar127 * fVar160 + fVar189 * fVar9;
    auVar108._0_4_ = fVar105 * fVar145 + fVar60 * fVar37 + fVar146 * fVar128 + fVar165 * fVar191;
    auVar108._4_4_ = fVar115 * fVar145 + fVar61 * fVar37 + fVar155 * fVar128 + fVar168 * fVar191;
    auVar108._8_4_ = fVar132 * fVar145 + fVar104 * fVar37 + fVar157 * fVar128 + fVar8 * fVar191;
    auVar108._12_4_ = fVar147 * fVar145 + fVar140 * fVar37 + fVar160 * fVar128 + fVar9 * fVar191;
    lVar30 = uVar28 * 4;
    fVar105 = *(float *)(bezier_basis0 + lVar30 + 0x13ec);
    fVar115 = *(float *)(bezier_basis0 + lVar30 + 0x13f0);
    fVar132 = *(float *)(bezier_basis0 + lVar30 + 0x13f4);
    fVar147 = *(float *)(bezier_basis0 + lVar30 + 0x13f8);
    lVar30 = uVar28 * 4;
    fVar60 = *(float *)(bezier_basis0 + lVar30 + 0x1870);
    fVar61 = *(float *)(bezier_basis0 + lVar30 + 0x1874);
    fVar104 = *(float *)(bezier_basis0 + lVar30 + 0x1878);
    fVar140 = *(float *)(bezier_basis0 + lVar30 + 0x187c);
    lVar30 = uVar28 * 4;
    fVar146 = *(float *)(bezier_basis0 + lVar30 + 0x1cf4);
    fVar155 = *(float *)(bezier_basis0 + lVar30 + 0x1cf8);
    fVar157 = *(float *)(bezier_basis0 + lVar30 + 0x1cfc);
    fVar160 = *(float *)(bezier_basis0 + lVar30 + 0x1d00);
    lVar30 = uVar28 * 4;
    fVar165 = *(float *)(bezier_basis0 + lVar30 + 0x2178);
    fVar168 = *(float *)(bezier_basis0 + lVar30 + 0x217c);
    fVar8 = *(float *)(bezier_basis0 + lVar30 + 0x2180);
    fVar9 = *(float *)(bezier_basis0 + lVar30 + 0x2184);
    fVar180 = fVar130 * fVar105 + fVar116 * fVar60 + fVar35 * fVar146 + fVar171 * fVar165;
    fVar181 = fVar130 * fVar115 + fVar116 * fVar61 + fVar35 * fVar155 + fVar171 * fVar168;
    fVar182 = fVar130 * fVar132 + fVar116 * fVar104 + fVar35 * fVar157 + fVar171 * fVar8;
    fVar183 = fVar130 * fVar147 + fVar116 * fVar140 + fVar35 * fVar160 + fVar171 * fVar9;
    fVar172 = fVar144 * fVar105 + fVar118 * fVar60 + fVar127 * fVar146 + fVar189 * fVar165;
    fVar173 = fVar144 * fVar115 + fVar118 * fVar61 + fVar127 * fVar155 + fVar189 * fVar168;
    fVar174 = fVar144 * fVar132 + fVar118 * fVar104 + fVar127 * fVar157 + fVar189 * fVar8;
    fVar175 = fVar144 * fVar147 + fVar118 * fVar140 + fVar127 * fVar160 + fVar189 * fVar9;
    fVar105 = fVar105 * fVar145 + fVar60 * fVar37 + fVar146 * fVar128 + fVar165 * fVar191;
    fVar115 = fVar115 * fVar145 + fVar61 * fVar37 + fVar155 * fVar128 + fVar168 * fVar191;
    fVar132 = fVar132 * fVar145 + fVar104 * fVar37 + fVar157 * fVar128 + fVar8 * fVar191;
    fVar147 = fVar147 * fVar145 + fVar140 * fVar37 + fVar160 * fVar128 + fVar9 * fVar191;
    uVar148 = -(uint)(uVar193 == 0);
    uVar156 = -(uint)(uVar193 == 1);
    uVar158 = -(uint)(uVar193 == 2);
    uVar159 = -(uint)(uVar193 == 3);
    uVar186 = -(uint)(uVar193 == 7);
    uVar190 = -(uint)(uVar193 == 6);
    uVar192 = -(uint)(uVar193 == 5);
    uVar193 = -(uint)(uVar193 == 4);
    local_368._4_4_ = (float)(~uVar190 & (uint)fVar181) * 0.055555556 + auVar87._4_4_;
    local_368._0_4_ = (float)(~uVar186 & (uint)fVar180) * 0.055555556 + auVar87._0_4_;
    fStack_360 = (float)(~uVar192 & (uint)fVar182) * 0.055555556 + auVar87._8_4_;
    fStack_35c = (float)(~uVar193 & (uint)fVar183) * 0.055555556 + auVar87._12_4_;
    auVar66 = minps(local_398,auVar87);
    auVar14._4_4_ = uStack_344;
    auVar14._0_4_ = local_348;
    auVar14._8_4_ = uStack_340;
    auVar14._12_4_ = uStack_33c;
    auVar93 = maxps(auVar14,auVar87);
    auVar122._0_8_ =
         CONCAT44(auVar87._4_4_ - (float)(~uVar156 & (uint)fVar181) * 0.055555556,
                  auVar87._0_4_ - (float)(~uVar148 & (uint)fVar180) * 0.055555556);
    auVar122._8_4_ = auVar87._8_4_ - (float)(~uVar158 & (uint)fVar182) * 0.055555556;
    auVar122._12_4_ = auVar87._12_4_ - (float)(~uVar159 & (uint)fVar183) * 0.055555556;
    auVar163._0_4_ = (float)(~uVar186 & (uint)fVar172) * 0.055555556 + auVar141._0_4_;
    auVar163._4_4_ = (float)(~uVar190 & (uint)fVar173) * 0.055555556 + auVar141._4_4_;
    auVar163._8_4_ = (float)(~uVar192 & (uint)fVar174) * 0.055555556 + auVar141._8_4_;
    auVar163._12_4_ = (float)(~uVar193 & (uint)fVar175) * 0.055555556 + auVar141._12_4_;
    auVar16._4_4_ = uStack_314;
    auVar16._0_4_ = local_318;
    auVar16._8_4_ = uStack_310;
    auVar16._12_4_ = uStack_30c;
    auVar94 = minps(auVar16,auVar141);
    auVar10._4_4_ = uStack_354;
    auVar10._0_4_ = local_358;
    auVar10._8_4_ = uStack_350;
    auVar10._12_4_ = uStack_34c;
    auVar187 = maxps(auVar10,auVar141);
    auVar142._0_8_ =
         CONCAT44(auVar141._4_4_ - (float)(~uVar156 & (uint)fVar173) * 0.055555556,
                  auVar141._0_4_ - (float)(~uVar148 & (uint)fVar172) * 0.055555556);
    auVar142._8_4_ = auVar141._8_4_ - (float)(~uVar158 & (uint)fVar174) * 0.055555556;
    auVar142._12_4_ = auVar141._12_4_ - (float)(~uVar159 & (uint)fVar175) * 0.055555556;
    auVar176._0_8_ =
         CONCAT44((float)(~uVar190 & (uint)fVar115) * 0.055555556 + auVar108._4_4_,
                  (float)(~uVar186 & (uint)fVar105) * 0.055555556 + auVar108._0_4_);
    auVar176._8_4_ = (float)(~uVar192 & (uint)fVar132) * 0.055555556 + auVar108._8_4_;
    auVar176._12_4_ = (float)(~uVar193 & (uint)fVar147) * 0.055555556 + auVar108._12_4_;
    auVar42._8_4_ = auVar176._8_4_;
    auVar42._0_8_ = auVar176._0_8_;
    auVar42._12_4_ = auVar176._12_4_;
    auVar18._4_4_ = uStack_304;
    auVar18._0_4_ = local_308;
    auVar18._8_4_ = uStack_300;
    auVar18._12_4_ = uStack_2fc;
    auVar149 = minps(auVar18,auVar108);
    auVar184 = maxps(local_378,auVar108);
    auVar109._0_8_ =
         CONCAT44(auVar108._4_4_ - (float)(~uVar156 & (uint)fVar115) * 0.055555556,
                  auVar108._0_4_ - (float)(~uVar148 & (uint)fVar105) * 0.055555556);
    auVar109._8_4_ = auVar108._8_4_ - (float)(~uVar158 & (uint)fVar132) * 0.055555556;
    auVar109._12_4_ = auVar108._12_4_ - (float)(~uVar159 & (uint)fVar147) * 0.055555556;
    auVar150._8_4_ = auVar122._8_4_;
    auVar150._0_8_ = auVar122._0_8_;
    auVar150._12_4_ = auVar122._12_4_;
    auVar151 = minps(auVar150,_local_368);
    auVar66 = minps(auVar66,auVar151);
    auVar152._8_4_ = auVar142._8_4_;
    auVar152._0_8_ = auVar142._0_8_;
    auVar152._12_4_ = auVar142._12_4_;
    auVar151 = minps(auVar152,auVar163);
    auVar94 = minps(auVar94,auVar151);
    auVar153._8_4_ = auVar109._8_4_;
    auVar153._0_8_ = auVar109._0_8_;
    auVar153._12_4_ = auVar109._12_4_;
    auVar151 = minps(auVar153,auVar42);
    auVar149 = minps(auVar149,auVar151);
    local_398._4_4_ = local_398._4_4_ & uVar73 | ~uVar73 & auVar66._4_4_;
    local_398._0_4_ = local_398._0_4_ & uVar62 | ~uVar62 & auVar66._0_4_;
    local_398._8_4_ = local_398._8_4_ & uVar74 | ~uVar74 & auVar66._8_4_;
    local_398._12_4_ = local_398._12_4_ & uVar75 | ~uVar75 & auVar66._12_4_;
    local_318 = local_318 & uVar62 | ~uVar62 & auVar94._0_4_;
    uStack_314 = uStack_314 & uVar73 | ~uVar73 & auVar94._4_4_;
    uStack_310 = uStack_310 & uVar74 | ~uVar74 & auVar94._8_4_;
    uStack_30c = uStack_30c & uVar75 | ~uVar75 & auVar94._12_4_;
    local_308 = local_308 & uVar62 | ~uVar62 & auVar149._0_4_;
    uStack_304 = uStack_304 & uVar73 | ~uVar73 & auVar149._4_4_;
    uStack_300 = uStack_300 & uVar74 | ~uVar74 & auVar149._8_4_;
    uStack_2fc = uStack_2fc & uVar75 | ~uVar75 & auVar149._12_4_;
    auVar66 = maxps(auVar122,_local_368);
    auVar66 = maxps(auVar93,auVar66);
    auVar149 = maxps(auVar142,auVar163);
    auVar93 = maxps(auVar187,auVar149);
    auVar149 = maxps(auVar109,auVar176);
    auVar149 = maxps(auVar184,auVar149);
    local_348 = local_348 & uVar62 | ~uVar62 & auVar66._0_4_;
    uStack_344 = uStack_344 & uVar73 | ~uVar73 & auVar66._4_4_;
    uStack_340 = uStack_340 & uVar74 | ~uVar74 & auVar66._8_4_;
    uStack_33c = uStack_33c & uVar75 | ~uVar75 & auVar66._12_4_;
    local_358 = local_358 & uVar62 | ~uVar62 & auVar93._0_4_;
    uStack_354 = uStack_354 & uVar73 | ~uVar73 & auVar93._4_4_;
    uStack_350 = uStack_350 & uVar74 | ~uVar74 & auVar93._8_4_;
    uStack_34c = uStack_34c & uVar75 | ~uVar75 & auVar93._12_4_;
    local_378._4_4_ = local_378._4_4_ & uVar73 | ~uVar73 & auVar149._4_4_;
    local_378._0_4_ = uVar84 & uVar62 | ~uVar62 & auVar149._0_4_;
    local_378._8_4_ = uVar178 & uVar74 | ~uVar74 & auVar149._8_4_;
    local_378._12_4_ = uVar179 & uVar75 | ~uVar75 & auVar149._12_4_;
    uVar28 = uVar28 + 4;
  }
  fVar38 = fVar38 + fVar117;
  fVar56 = fVar56 + fVar113;
  fVar58 = fVar58 + fVar129;
  fVar39 = fVar39 + fVar86;
  fVar57 = fVar57 + fVar101;
  fVar59 = fVar59 + fVar103;
  fVar86 = (fVar166 + fVar91) * 0.33333334 + fVar38;
  fVar101 = (fVar169 + fVar100) * 0.33333334 + fVar56;
  fVar103 = (fVar161 + fVar102) * 0.33333334 + fVar58;
  fVar35 = fVar39 - (fVar36 + fVar131) * 0.33333334;
  fVar127 = fVar57 - (fVar85 + fVar138) * 0.33333334;
  fVar128 = fVar59 - (fVar114 + fVar139) * 0.33333334;
  auVar43._4_4_ = local_398._0_4_;
  auVar43._0_4_ = local_398._4_4_;
  auVar43._8_4_ = local_398._12_4_;
  auVar43._12_4_ = local_398._8_4_;
  auVar66 = minps(auVar43,local_398);
  auVar67._0_8_ = auVar66._8_8_;
  auVar67._8_4_ = auVar66._0_4_;
  auVar67._12_4_ = auVar66._4_4_;
  auVar93 = minps(auVar67,auVar66);
  auVar17._4_4_ = uStack_314;
  auVar17._0_4_ = local_318;
  auVar17._8_4_ = uStack_310;
  auVar17._12_4_ = uStack_30c;
  auVar44._4_4_ = local_318;
  auVar44._0_4_ = uStack_314;
  auVar44._8_4_ = uStack_30c;
  auVar44._12_4_ = uStack_310;
  auVar66 = minps(auVar44,auVar17);
  auVar110._0_8_ = auVar66._8_8_;
  auVar110._8_4_ = auVar66._0_4_;
  auVar110._12_4_ = auVar66._4_4_;
  auVar66 = minps(auVar110,auVar66);
  auVar19._4_4_ = uStack_304;
  auVar19._0_4_ = local_308;
  auVar19._8_4_ = uStack_300;
  auVar19._12_4_ = uStack_2fc;
  auVar45._4_4_ = local_308;
  auVar45._0_4_ = uStack_304;
  auVar45._8_4_ = uStack_2fc;
  auVar45._12_4_ = uStack_300;
  auVar149 = minps(auVar45,auVar19);
  auVar46._0_8_ = auVar149._8_8_;
  auVar46._8_4_ = auVar149._0_4_;
  auVar46._12_4_ = auVar149._4_4_;
  auVar90._4_4_ = auVar66._0_4_;
  auVar90._0_4_ = auVar93._0_4_;
  auVar15._4_4_ = uStack_344;
  auVar15._0_4_ = local_348;
  auVar15._8_4_ = uStack_340;
  auVar15._12_4_ = uStack_33c;
  auVar47._4_4_ = local_348;
  auVar47._0_4_ = uStack_344;
  auVar47._8_4_ = uStack_33c;
  auVar47._12_4_ = uStack_340;
  auVar66 = maxps(auVar47,auVar15);
  auVar68._0_8_ = auVar66._8_8_;
  auVar68._8_4_ = auVar66._0_4_;
  auVar68._12_4_ = auVar66._4_4_;
  auVar93 = maxps(auVar68,auVar66);
  auVar11._4_4_ = uStack_354;
  auVar11._0_4_ = local_358;
  auVar11._8_4_ = uStack_350;
  auVar11._12_4_ = uStack_34c;
  auVar48._4_4_ = local_358;
  auVar48._0_4_ = uStack_354;
  auVar48._8_4_ = uStack_34c;
  auVar48._12_4_ = uStack_350;
  auVar66 = maxps(auVar48,auVar11);
  auVar111._0_8_ = auVar66._8_8_;
  auVar111._8_4_ = auVar66._0_4_;
  auVar111._12_4_ = auVar66._4_4_;
  auVar66 = maxps(auVar111,auVar66);
  auVar134._4_4_ = uVar84;
  auVar134._0_4_ = local_378._4_4_;
  auVar134._8_4_ = uVar179;
  auVar134._12_4_ = uVar178;
  auVar94 = maxps(auVar134,local_378);
  auVar135._0_8_ = auVar94._8_8_;
  auVar135._8_4_ = auVar94._0_4_;
  auVar135._12_4_ = auVar94._4_4_;
  auVar97._4_4_ = auVar66._0_4_;
  auVar97._0_4_ = auVar93._0_4_;
  uVar28 = 0;
  _local_368 = _DAT_01f45a40;
  local_3b8._8_8_ = 0x7f8000007f800000;
  local_3b8._0_8_ = 0x7f8000007f800000;
  local_358 = 0x7f800000;
  uStack_354 = 0x7f800000;
  uStack_350 = 0x7f800000;
  uStack_34c = 0x7f800000;
  local_378._8_8_ = 0x7f8000007f800000;
  local_378._0_8_ = 0x7f8000007f800000;
  auVar96 = _DAT_01f45a40;
  auVar66 = _DAT_01f45a40;
  while( true ) {
    uVar84 = local_368._0_4_;
    uVar178 = local_368._8_4_;
    uVar179 = local_368._12_4_;
    uVar193 = local_378._0_4_;
    uVar62 = local_378._8_4_;
    uVar73 = local_378._12_4_;
    if (7 < uVar28) break;
    uVar74 = (uint)uVar28;
    uVar75 = -(uint)(-0x7ffffff9 < (int)(uVar74 ^ 0x80000000));
    uVar148 = -(uint)(-0x7ffffff9 < (int)(uVar74 ^ 0x80000000));
    uVar156 = -(uint)(-0x7ffffff9 < (int)(uVar74 ^ 0x80000000));
    uVar158 = -(uint)(-0x7ffffff9 < (int)(uVar74 ^ 0x80000000));
    lVar30 = uVar28 * 4;
    fVar85 = *(float *)(bezier_basis0 + lVar30 + 0x1dc);
    fVar36 = *(float *)(bezier_basis0 + lVar30 + 0x1e0);
    fVar114 = *(float *)(bezier_basis0 + lVar30 + 0x1e4);
    fVar116 = *(float *)(bezier_basis0 + lVar30 + 0x1e8);
    lVar30 = uVar28 * 4;
    fVar118 = *(float *)(bezier_basis0 + lVar30 + 0x660);
    fVar37 = *(float *)(bezier_basis0 + lVar30 + 0x664);
    fVar117 = *(float *)(bezier_basis0 + lVar30 + 0x668);
    fVar105 = *(float *)(bezier_basis0 + lVar30 + 0x66c);
    lVar30 = uVar28 * 4;
    fVar113 = *(float *)(bezier_basis0 + lVar30 + 0xae4);
    fVar115 = *(float *)(bezier_basis0 + lVar30 + 0xae8);
    fVar129 = *(float *)(bezier_basis0 + lVar30 + 0xaec);
    fVar132 = *(float *)(bezier_basis0 + lVar30 + 0xaf0);
    lVar30 = uVar28 * 4;
    fVar166 = *(float *)(bezier_basis0 + lVar30 + 0xf68);
    fVar169 = *(float *)(bezier_basis0 + lVar30 + 0xf6c);
    fVar161 = *(float *)(bezier_basis0 + lVar30 + 0xf70);
    fVar130 = *(float *)(bezier_basis0 + lVar30 + 0xf74);
    auVar88._0_4_ = fVar38 * fVar85 + fVar86 * fVar118 + fVar35 * fVar113 + fVar39 * fVar166;
    auVar88._4_4_ = fVar38 * fVar36 + fVar86 * fVar37 + fVar35 * fVar115 + fVar39 * fVar169;
    auVar88._8_4_ = fVar38 * fVar114 + fVar86 * fVar117 + fVar35 * fVar129 + fVar39 * fVar161;
    auVar88._12_4_ = fVar38 * fVar116 + fVar86 * fVar105 + fVar35 * fVar132 + fVar39 * fVar130;
    auVar77._0_4_ = fVar56 * fVar85 + fVar101 * fVar118 + fVar127 * fVar113 + fVar57 * fVar166;
    auVar77._4_4_ = fVar56 * fVar36 + fVar101 * fVar37 + fVar127 * fVar115 + fVar57 * fVar169;
    auVar77._8_4_ = fVar56 * fVar114 + fVar101 * fVar117 + fVar127 * fVar129 + fVar57 * fVar161;
    auVar77._12_4_ = fVar56 * fVar116 + fVar101 * fVar105 + fVar127 * fVar132 + fVar57 * fVar130;
    local_138._0_4_ = fVar85 * fVar58 + fVar118 * fVar103 + fVar113 * fVar128 + fVar166 * fVar59;
    local_138._4_4_ = fVar36 * fVar58 + fVar37 * fVar103 + fVar115 * fVar128 + fVar169 * fVar59;
    fStack_130 = fVar114 * fVar58 + fVar117 * fVar103 + fVar129 * fVar128 + fVar161 * fVar59;
    fStack_12c = fVar116 * fVar58 + fVar105 * fVar103 + fVar132 * fVar128 + fVar130 * fVar59;
    lVar30 = uVar28 * 4;
    fVar85 = *(float *)(bezier_basis0 + lVar30 + 0x13ec);
    fVar36 = *(float *)(bezier_basis0 + lVar30 + 0x13f0);
    fVar114 = *(float *)(bezier_basis0 + lVar30 + 0x13f4);
    fVar116 = *(float *)(bezier_basis0 + lVar30 + 0x13f8);
    lVar30 = uVar28 * 4;
    fVar118 = *(float *)(bezier_basis0 + lVar30 + 0x1870);
    fVar37 = *(float *)(bezier_basis0 + lVar30 + 0x1874);
    fVar117 = *(float *)(bezier_basis0 + lVar30 + 0x1878);
    fVar105 = *(float *)(bezier_basis0 + lVar30 + 0x187c);
    lVar30 = uVar28 * 4;
    fVar113 = *(float *)(bezier_basis0 + lVar30 + 0x1cf4);
    fVar115 = *(float *)(bezier_basis0 + lVar30 + 0x1cf8);
    fVar129 = *(float *)(bezier_basis0 + lVar30 + 0x1cfc);
    fVar132 = *(float *)(bezier_basis0 + lVar30 + 0x1d00);
    lVar30 = uVar28 * 4;
    fVar166 = *(float *)(bezier_basis0 + lVar30 + 0x2178);
    fVar169 = *(float *)(bezier_basis0 + lVar30 + 0x217c);
    fVar161 = *(float *)(bezier_basis0 + lVar30 + 0x2180);
    fVar130 = *(float *)(bezier_basis0 + lVar30 + 0x2184);
    fVar189 = fVar38 * fVar85 + fVar86 * fVar118 + fVar35 * fVar113 + fVar39 * fVar166;
    fVar191 = fVar38 * fVar36 + fVar86 * fVar37 + fVar35 * fVar115 + fVar39 * fVar169;
    fVar60 = fVar38 * fVar114 + fVar86 * fVar117 + fVar35 * fVar129 + fVar39 * fVar161;
    fVar61 = fVar38 * fVar116 + fVar86 * fVar105 + fVar35 * fVar132 + fVar39 * fVar130;
    fVar144 = fVar56 * fVar85 + fVar101 * fVar118 + fVar127 * fVar113 + fVar57 * fVar166;
    fVar145 = fVar56 * fVar36 + fVar101 * fVar37 + fVar127 * fVar115 + fVar57 * fVar169;
    fVar147 = fVar56 * fVar114 + fVar101 * fVar117 + fVar127 * fVar129 + fVar57 * fVar161;
    fVar171 = fVar56 * fVar116 + fVar101 * fVar105 + fVar127 * fVar132 + fVar57 * fVar130;
    fVar85 = fVar85 * fVar58 + fVar118 * fVar103 + fVar113 * fVar128 + fVar166 * fVar59;
    fVar36 = fVar36 * fVar58 + fVar37 * fVar103 + fVar115 * fVar128 + fVar169 * fVar59;
    fVar114 = fVar114 * fVar58 + fVar117 * fVar103 + fVar129 * fVar128 + fVar161 * fVar59;
    fVar116 = fVar116 * fVar58 + fVar105 * fVar103 + fVar132 * fVar128 + fVar130 * fVar59;
    uVar159 = -(uint)(uVar74 == 0);
    uVar186 = -(uint)(uVar74 == 1);
    uVar190 = -(uint)(uVar74 == 2);
    uVar192 = -(uint)(uVar74 == 3);
    uVar162 = -(uint)(uVar74 == 7);
    uVar167 = -(uint)(uVar74 == 6);
    uVar170 = -(uint)(uVar74 == 5);
    uVar74 = -(uint)(uVar74 == 4);
    auVar49._0_4_ = (float)(~uVar162 & (uint)fVar189) * 0.055555556 + auVar88._0_4_;
    auVar49._4_4_ = (float)(~uVar167 & (uint)fVar191) * 0.055555556 + auVar88._4_4_;
    auVar49._8_4_ = (float)(~uVar170 & (uint)fVar60) * 0.055555556 + auVar88._8_4_;
    auVar49._12_4_ = (float)(~uVar74 & (uint)fVar61) * 0.055555556 + auVar88._12_4_;
    auVar177 = minps(local_3b8,auVar88);
    auVar151 = maxps(_local_368,auVar88);
    auVar185._0_8_ =
         CONCAT44(auVar88._4_4_ - (float)(~uVar186 & (uint)fVar191) * 0.055555556,
                  auVar88._0_4_ - (float)(~uVar159 & (uint)fVar189) * 0.055555556);
    auVar185._8_4_ = auVar88._8_4_ - (float)(~uVar190 & (uint)fVar60) * 0.055555556;
    auVar185._12_4_ = auVar88._12_4_ - (float)(~uVar192 & (uint)fVar61) * 0.055555556;
    auVar89._0_4_ = (float)(~uVar162 & (uint)fVar144) * 0.055555556 + auVar77._0_4_;
    auVar89._4_4_ = (float)(~uVar167 & (uint)fVar145) * 0.055555556 + auVar77._4_4_;
    auVar89._8_4_ = (float)(~uVar170 & (uint)fVar147) * 0.055555556 + auVar77._8_4_;
    auVar89._12_4_ = (float)(~uVar74 & (uint)fVar171) * 0.055555556 + auVar77._12_4_;
    auVar12._4_4_ = uStack_354;
    auVar12._0_4_ = local_358;
    auVar12._8_4_ = uStack_350;
    auVar12._12_4_ = uStack_34c;
    auVar93 = minps(auVar12,auVar77);
    auVar143 = maxps(auVar66,auVar77);
    auVar78._0_8_ =
         CONCAT44(auVar77._4_4_ - (float)(~uVar186 & (uint)fVar145) * 0.055555556,
                  auVar77._0_4_ - (float)(~uVar159 & (uint)fVar144) * 0.055555556);
    auVar78._8_4_ = auVar77._8_4_ - (float)(~uVar190 & (uint)fVar147) * 0.055555556;
    auVar78._12_4_ = auVar77._12_4_ - (float)(~uVar192 & (uint)fVar171) * 0.055555556;
    auVar164._0_4_ = (float)(~uVar162 & (uint)fVar85) * 0.055555556 + (float)local_138._0_4_;
    auVar164._4_4_ = (float)(~uVar167 & (uint)fVar36) * 0.055555556 + (float)local_138._4_4_;
    auVar164._8_4_ = (float)(~uVar170 & (uint)fVar114) * 0.055555556 + fStack_130;
    auVar164._12_4_ = (float)(~uVar74 & (uint)fVar116) * 0.055555556 + fStack_12c;
    auVar136 = minps(local_378,_local_138);
    auVar184 = maxps(auVar96,_local_138);
    auVar188._0_8_ =
         CONCAT44((float)local_138._4_4_ - (float)(~uVar186 & (uint)fVar36) * 0.055555556,
                  (float)local_138._0_4_ - (float)(~uVar159 & (uint)fVar85) * 0.055555556);
    auVar188._8_4_ = fStack_130 - (float)(~uVar190 & (uint)fVar114) * 0.055555556;
    auVar188._12_4_ = fStack_12c - (float)(~uVar192 & (uint)fVar116) * 0.055555556;
    auVar123._8_4_ = auVar185._8_4_;
    auVar123._0_8_ = auVar185._0_8_;
    auVar123._12_4_ = auVar185._12_4_;
    auVar187 = minps(auVar123,auVar49);
    auVar177 = minps(auVar177,auVar187);
    auVar124._8_4_ = auVar78._8_4_;
    auVar124._0_8_ = auVar78._0_8_;
    auVar124._12_4_ = auVar78._12_4_;
    auVar187 = minps(auVar124,auVar89);
    auVar93 = minps(auVar93,auVar187);
    auVar125._8_4_ = auVar188._8_4_;
    auVar125._0_8_ = auVar188._0_8_;
    auVar125._12_4_ = auVar188._12_4_;
    auVar187 = minps(auVar125,auVar164);
    auVar187 = minps(auVar136,auVar187);
    local_3b8._4_4_ = local_3b8._4_4_ & uVar148 | ~uVar148 & auVar177._4_4_;
    local_3b8._0_4_ = local_3b8._0_4_ & uVar75 | ~uVar75 & auVar177._0_4_;
    local_3b8._8_4_ = local_3b8._8_4_ & uVar156 | ~uVar156 & auVar177._8_4_;
    local_3b8._12_4_ = local_3b8._12_4_ & uVar158 | ~uVar158 & auVar177._12_4_;
    local_358 = local_358 & uVar75 | ~uVar75 & auVar93._0_4_;
    uStack_354 = uStack_354 & uVar148 | ~uVar148 & auVar93._4_4_;
    uStack_350 = uStack_350 & uVar156 | ~uVar156 & auVar93._8_4_;
    uStack_34c = uStack_34c & uVar158 | ~uVar158 & auVar93._12_4_;
    local_378._4_4_ = local_378._4_4_ & uVar148 | ~uVar148 & auVar187._4_4_;
    local_378._0_4_ = uVar193 & uVar75 | ~uVar75 & auVar187._0_4_;
    local_378._8_4_ = uVar62 & uVar156 | ~uVar156 & auVar187._8_4_;
    local_378._12_4_ = uVar73 & uVar158 | ~uVar158 & auVar187._12_4_;
    auVar93 = maxps(auVar185,auVar49);
    auVar93 = maxps(auVar151,auVar93);
    auVar151 = maxps(auVar78,auVar89);
    auVar187 = maxps(auVar143,auVar151);
    auVar151 = maxps(auVar188,auVar164);
    auVar151 = maxps(auVar184,auVar151);
    local_368._4_4_ = local_368._4_4_ & uVar148 | ~uVar148 & auVar93._4_4_;
    local_368._0_4_ = uVar84 & uVar75 | ~uVar75 & auVar93._0_4_;
    fStack_360 = (float)(uVar178 & uVar156 | ~uVar156 & auVar93._8_4_);
    fStack_35c = (float)(uVar179 & uVar158 | ~uVar158 & auVar93._12_4_);
    auVar79._0_4_ = ~uVar75 & auVar187._0_4_;
    auVar79._4_4_ = ~uVar148 & auVar187._4_4_;
    auVar79._8_4_ = ~uVar156 & auVar187._8_4_;
    auVar79._12_4_ = ~uVar158 & auVar187._12_4_;
    auVar154._0_4_ = auVar66._0_4_ & uVar75;
    auVar154._4_4_ = auVar66._4_4_ & uVar148;
    auVar154._8_4_ = auVar66._8_4_ & uVar156;
    auVar154._12_4_ = auVar66._12_4_ & uVar158;
    auVar66 = auVar154 | auVar79;
    auVar95._0_4_ = auVar96._0_4_ & uVar75;
    auVar95._4_4_ = auVar96._4_4_ & uVar148;
    auVar95._8_4_ = auVar96._8_4_ & uVar156;
    auVar95._12_4_ = auVar96._12_4_ & uVar158;
    auVar96._0_4_ = ~uVar75 & auVar151._0_4_;
    auVar96._4_4_ = ~uVar148 & auVar151._4_4_;
    auVar96._8_4_ = ~uVar156 & auVar151._8_4_;
    auVar96._12_4_ = ~uVar158 & auVar151._12_4_;
    auVar96 = auVar95 | auVar96;
    uVar28 = uVar28 + 4;
  }
  auVar149 = minps(auVar46,auVar149);
  auVar90._8_4_ = auVar149._0_4_;
  auVar90._12_4_ = 0;
  auVar149 = maxps(auVar135,auVar94);
  auVar97._8_4_ = auVar149._0_4_;
  auVar97._12_4_ = 0;
  auVar50._4_4_ = local_3b8._0_4_;
  auVar50._0_4_ = local_3b8._4_4_;
  auVar50._8_4_ = local_3b8._12_4_;
  auVar50._12_4_ = local_3b8._8_4_;
  auVar149 = minps(auVar50,local_3b8);
  auVar69._0_8_ = auVar149._8_8_;
  auVar69._8_4_ = auVar149._0_4_;
  auVar69._12_4_ = auVar149._4_4_;
  auVar93 = minps(auVar69,auVar149);
  auVar13._4_4_ = uStack_354;
  auVar13._0_4_ = local_358;
  auVar13._8_4_ = uStack_350;
  auVar13._12_4_ = uStack_34c;
  auVar51._4_4_ = local_358;
  auVar51._0_4_ = uStack_354;
  auVar51._8_4_ = uStack_34c;
  auVar51._12_4_ = uStack_350;
  auVar149 = minps(auVar51,auVar13);
  auVar80._0_8_ = auVar149._8_8_;
  auVar80._8_4_ = auVar149._0_4_;
  auVar80._12_4_ = auVar149._4_4_;
  auVar94 = minps(auVar80,auVar149);
  auVar52._4_4_ = uVar193;
  auVar52._0_4_ = local_378._4_4_;
  auVar52._8_4_ = uVar73;
  auVar52._12_4_ = uVar62;
  auVar149 = minps(auVar52,local_378);
  auVar70._0_8_ = auVar149._8_8_;
  auVar70._8_4_ = auVar149._0_4_;
  auVar70._12_4_ = auVar149._4_4_;
  auVar149 = minps(auVar70,auVar149);
  auVar81._4_4_ = auVar94._0_4_;
  auVar81._0_4_ = auVar93._0_4_;
  auVar81._8_4_ = auVar149._0_4_;
  auVar81._12_4_ = 0;
  auVar94 = minps(auVar90,auVar81);
  auVar53._4_4_ = uVar84;
  auVar53._0_4_ = local_368._4_4_;
  auVar53._8_4_ = uVar179;
  auVar53._12_4_ = uVar178;
  auVar149 = maxps(auVar53,_local_368);
  auVar71._0_8_ = auVar149._8_8_;
  auVar71._8_4_ = auVar149._0_4_;
  auVar71._12_4_ = auVar149._4_4_;
  auVar149 = maxps(auVar71,auVar149);
  auVar54._4_4_ = auVar66._0_4_;
  auVar54._0_4_ = auVar66._4_4_;
  auVar54._8_4_ = auVar66._12_4_;
  auVar54._12_4_ = auVar66._8_4_;
  auVar66 = maxps(auVar54,auVar66);
  auVar82._0_8_ = auVar66._8_8_;
  auVar82._8_4_ = auVar66._0_4_;
  auVar82._12_4_ = auVar66._4_4_;
  auVar93 = maxps(auVar82,auVar66);
  auVar55._4_4_ = auVar96._0_4_;
  auVar55._0_4_ = auVar96._4_4_;
  auVar55._8_4_ = auVar96._12_4_;
  auVar55._12_4_ = auVar96._8_4_;
  auVar66 = maxps(auVar55,auVar96);
  auVar72._0_8_ = auVar66._8_8_;
  auVar72._8_4_ = auVar66._0_4_;
  auVar72._12_4_ = auVar66._4_4_;
  auVar66 = maxps(auVar72,auVar66);
  auVar83._4_4_ = auVar93._0_4_;
  auVar83._0_4_ = auVar149._0_4_;
  auVar83._8_4_ = auVar66._0_4_;
  auVar83._12_4_ = 0;
  auVar66 = maxps(auVar97,auVar83);
  auVar98._0_4_ = -(uint)(auVar66._0_4_ < 1.844e+18 && -1.844e+18 < auVar94._0_4_);
  auVar98._4_4_ = -(uint)(auVar66._4_4_ < 1.844e+18 && -1.844e+18 < auVar94._4_4_);
  auVar98._8_4_ = -(uint)(auVar66._8_4_ < 1.844e+18 && -1.844e+18 < auVar94._8_4_);
  auVar98._12_4_ = -(uint)(auVar66._12_4_ < 1.844e+18 && -1.844e+18 < auVar94._12_4_);
  uVar26 = movmskps((int)lVar29,auVar98);
  pBVar27 = (BufferView<embree::Vec3fa> *)(ulong)CONCAT31((int3)((uint)uVar26 >> 8),~(byte)uVar26);
  uVar21 = uVar21 + 1;
  if ((~(byte)uVar26 & 7) != 0) goto LAB_0024844d;
  goto LAB_00247378;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }